

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O2

void __thiscall
QBlitterPaintEngine::drawPixmap(QBlitterPaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  QBlitterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar1;
  bool opacity;
  bool bVar2;
  int iVar3;
  int iVar4;
  QClipData *pQVar5;
  const_iterator r_00;
  const_iterator pQVar6;
  QPaintDevice *pQVar7;
  QPaintEngineState *pQVar8;
  QRect *rect;
  long in_FS_OFFSET;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  opacity = CapabilitiesToStateMask::canBlitterDrawPixmapOpacity(&this_00->caps,pm);
  if (!opacity) {
    bVar2 = CapabilitiesToStateMask::canBlitterDrawPixmap(&this_00->caps,r,pm,sr);
    if (!bVar2) {
      QBlitterPaintEnginePrivate::lock(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QRasterPaintEngine::drawPixmap(&this->super_QRasterPaintEngine,r,pm,sr);
        return;
      }
      goto LAB_0036ce07;
    }
  }
  QBlitterPaintEnginePrivate::unlock(this_00);
  local_58.xp = r->xp;
  local_58.yp = r->yp;
  local_58.w = r->w;
  local_58.h = r->h;
  if (this_00->hasXForm != 0) {
    pQVar1 = (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.state;
    pQVar8 = pQVar1 + -2;
    if (pQVar1 == (QPaintEngineState *)0x0) {
      pQVar8 = (QPaintEngineState *)0x0;
    }
    QTransform::mapRect(&local_58,(QTransform *)(pQVar8 + 0x36),r);
  }
  pQVar5 = QRasterPaintEnginePrivate::clip((QRasterPaintEnginePrivate *)this_00);
  if (pQVar5 == (QClipData *)0x0) {
    pQVar7 = QPaintEngine::paintDevice((QPaintEngine *)this);
    iVar3 = (*pQVar7->_vptr_QPaintDevice[4])(pQVar7,1);
    pQVar7 = QPaintEngine::paintDevice((QPaintEngine *)this);
    iVar4 = (*pQVar7->_vptr_QPaintDevice[4])(pQVar7,2);
    local_78.h = (qreal)iVar4;
    local_78.xp = 0.0;
    local_78.yp = 0.0;
    local_78.w = (double)iVar3;
LAB_0036cdd9:
    QBlitterPaintEnginePrivate::clipAndDrawPixmap(this_00,&local_78,&local_58,pm,sr,opacity);
  }
  else {
    if ((pQVar5->field_0x48 & 2) != 0) {
      QRectF::QRectF(&local_78,&pQVar5->clipRect);
      goto LAB_0036cdd9;
    }
    if ((pQVar5->field_0x48 & 4) != 0) {
      r_00 = QRegion::begin(&pQVar5->clipRegion);
      pQVar6 = QRegion::end(&pQVar5->clipRegion);
      for (; r_00 != pQVar6; r_00 = r_00 + 1) {
        QRectF::QRectF(&local_78,r_00);
        QBlitterPaintEnginePrivate::clipAndDrawPixmap(this_00,&local_78,&local_58,pm,sr,opacity);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0036ce07:
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QBlitterPaintEngine);
    bool canDrawOpacity;

    canDrawOpacity = d->caps.canBlitterDrawPixmapOpacity(pm);
    if (canDrawOpacity || (d->caps.canBlitterDrawPixmap(r, pm, sr))) {

        d->unlock();
        QRectF targetRect = r;
        if (d->hasXForm)
            targetRect = state()->matrix.mapRect(r);
        const QClipData *clipData = d->clip();
        if (clipData) {
            if (clipData->hasRectClip) {
                d->clipAndDrawPixmap(clipData->clipRect, targetRect, pm, sr, canDrawOpacity);
            } else if (clipData->hasRegionClip) {
                for (const QRect &rect : clipData->clipRegion)
                    d->clipAndDrawPixmap(rect, targetRect, pm, sr, canDrawOpacity);
            }
        } else {
            QRectF deviceRect(0, 0, paintDevice()->width(), paintDevice()->height());
            d->clipAndDrawPixmap(deviceRect, targetRect, pm, sr, canDrawOpacity);
        }
    }else {
        d->lock();
        d->pmData->markRasterOverlay(r);
        QRasterPaintEngine::drawPixmap(r, pm, sr);
    }
}